

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.cpp
# Opt level: O2

void __thiscall xscript::parser::ast_node::ast_node(ast_node *this,type_t t,ast_node *p)

{
  __shared_ptr<xscript::parser::symbol_table,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  this->parent = p;
  (this->children).
  super__Vector_base<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->children).
  super__Vector_base<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).
  super__Vector_base<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->type = t;
  tokenizer::token::token(&this->token);
  (this->regs).super___shared_ptr<xscript::parser::register_allocator,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->regs).super___shared_ptr<xscript::parser::register_allocator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->symbols).super___shared_ptr<xscript::parser::symbol_table,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->symbols).super___shared_ptr<xscript::parser::symbol_table,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this->parent != (ast_node *)0x0) {
    if (t - ROOT < 2) {
      std::make_shared<xscript::parser::symbol_table>();
      std::__shared_ptr<xscript::parser::symbol_table,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->symbols).
                  super___shared_ptr<xscript::parser::symbol_table,_(__gnu_cxx::_Lock_policy)2>,
                 &local_30);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    }
    else {
      std::__shared_ptr<xscript::parser::symbol_table,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->symbols).
                  super___shared_ptr<xscript::parser::symbol_table,_(__gnu_cxx::_Lock_policy)2>,
                 &(this->parent->symbols).
                  super___shared_ptr<xscript::parser::symbol_table,_(__gnu_cxx::_Lock_policy)2>);
    }
    if ((t == FUNCTION_DECLARATION) || (t == ROOT)) {
      std::make_unique<xscript::parser::register_allocator>();
      std::__shared_ptr<xscript::parser::register_allocator,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<xscript::parser::register_allocator,(__gnu_cxx::_Lock_policy)2> *)
                 &this->regs,
                 (unique_ptr<xscript::parser::register_allocator,_std::default_delete<xscript::parser::register_allocator>_>
                  *)&local_30);
      std::
      unique_ptr<xscript::parser::register_allocator,_std::default_delete<xscript::parser::register_allocator>_>
      ::~unique_ptr((unique_ptr<xscript::parser::register_allocator,_std::default_delete<xscript::parser::register_allocator>_>
                     *)&local_30);
    }
    else {
      std::__shared_ptr<xscript::parser::register_allocator,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->regs).
                  super___shared_ptr<xscript::parser::register_allocator,_(__gnu_cxx::_Lock_policy)2>
                 ,&(this->parent->regs).
                   super___shared_ptr<xscript::parser::register_allocator,_(__gnu_cxx::_Lock_policy)2>
                );
    }
    return;
  }
  __assert_fail("parent != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/ast_node.cpp"
                ,0x13,"xscript::parser::ast_node::ast_node(type_t, ast_node *)");
}

Assistant:

ast_node::ast_node(type_t t, ast_node* p) :
    parent(p),
    type(t)
{
    assert(parent != nullptr);

    if (t == ROOT || t == BLOCK) {
        symbols = std::make_shared<symbol_table>();
    } else {
        symbols = parent->get_symbols();
    }

    if (t == ROOT || t == FUNCTION_DECLARATION) {
        regs = std::make_unique<register_allocator>();
    } else {
        regs = parent->get_regs();
    }

}